

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adjacency_graph.cpp
# Opt level: O3

void __thiscall
test_adjacency_graph_data_Test::~test_adjacency_graph_data_Test
          (test_adjacency_graph_data_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(test_adjacency_graph, data) {
  Adjacency_Graph<false> graph;
  EXPECT_EQ(graph.data().first, nullptr);
  EXPECT_EQ(graph.data().second, nullptr);

  graph.resize(4);  // we have no edges yet, so the vertex list remains a nullptr.
  EXPECT_EQ(graph.data().first, nullptr);
  EXPECT_NE(graph.data().second, nullptr);

  graph.insert(std::make_pair(0, 1));
  EXPECT_NE(graph.data().first, nullptr);
  EXPECT_NE(graph.data().second, nullptr);
}